

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  bool bVar1;
  undefined4 uVar2;
  int new_capacity;
  long lVar3;
  ImGuiStoragePair *pIVar4;
  ptrdiff_t off;
  ImGuiStoragePair *v_local;
  ImGuiStoragePair *it_local;
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_local;
  
  bVar1 = false;
  if (this->Data <= it) {
    bVar1 = it <= this->Data + this->Size;
  }
  if (!bVar1) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                  ,0x51e,
                  "T *ImVector<ImGuiStorage::ImGuiStoragePair>::insert(const T *, const T &) [T = ImGuiStorage::ImGuiStoragePair]"
                 );
  }
  lVar3 = (long)it - (long)this->Data >> 4;
  if (this->Size == this->Capacity) {
    new_capacity = _grow_capacity(this,this->Size + 1);
    reserve(this,new_capacity);
  }
  if (lVar3 < this->Size) {
    memmove(this->Data + lVar3 + 1,this->Data + lVar3,(this->Size - lVar3) * 0x10);
  }
  pIVar4 = this->Data + lVar3;
  uVar2 = *(undefined4 *)&v->field_0x4;
  pIVar4->key = v->key;
  *(undefined4 *)&pIVar4->field_0x4 = uVar2;
  pIVar4->field_1 = v->field_1;
  this->Size = this->Size + 1;
  return this->Data + lVar3;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }